

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

Image * Image_Function_Helper::ExtractChannel
                  (Image *__return_storage_ptr__,ExtractChannelForm4 extractChannel,Image *in,
                  uint8_t channelId)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x01','\x01');
  (*extractChannel)(in,0,0,__return_storage_ptr__,0,0,in->_width,in->_height,channelId);
  return __return_storage_ptr__;
}

Assistant:

Image ExtractChannel( FunctionTable::ExtractChannelForm4 extractChannel,
                          const Image & in, uint8_t channelId )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        extractChannel( in, 0, 0, out, 0, 0, in.width(), in.height(), channelId );

        return out;
    }